

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_comparison_suite.cpp
# Opt level: O0

void equality_suite::compare_map_equal_boolean_literal(void)

{
  size_type sVar1;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *ppVar2;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_00;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_01;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_02;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_458;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_440;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_428;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_410;
  undefined1 local_3e6;
  bool local_3e5;
  int local_3e4;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_3e0;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_3d8;
  undefined1 local_378 [64];
  undefined1 local_338 [2];
  undefined1 local_336;
  bool local_335;
  int local_334 [3];
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_328;
  undefined1 local_2c8 [64];
  undefined1 local_288 [2];
  undefined1 local_286;
  bool local_285;
  int local_284 [3];
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_278;
  undefined1 local_218 [64];
  undefined1 local_1d8 [2];
  undefined1 local_1d6;
  bool local_1d5;
  int local_1d4 [3];
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_1c8;
  undefined1 local_168 [76];
  undefined1 local_11c [2];
  undefined1 local_11a;
  bool local_119;
  basic_variable<std::allocator<char>_> local_118;
  undefined1 local_dc [2];
  undefined1 local_da;
  bool local_d9;
  basic_variable<std::allocator<char>_> local_d8;
  undefined1 local_9c [2];
  undefined1 local_9a;
  bool local_99;
  basic_variable<std::allocator<char>_> local_98;
  undefined1 local_5e [20];
  undefined1 local_4a;
  bool local_49;
  basic_variable<std::allocator<char>_> local_48;
  undefined1 local_a [2];
  
  trial::dynamic::basic_map<std::allocator<char>_>::make();
  local_49 = false;
  local_a[0] = trial::dynamic::operator==(&local_48,&local_49);
  local_4a = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make() == false","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xdca,"void equality_suite::compare_map_equal_boolean_literal()",local_a,&local_4a);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_48);
  trial::dynamic::basic_map<std::allocator<char>_>::make();
  local_99 = false;
  local_5e[0] = trial::dynamic::operator!=(&local_98,&local_99);
  local_9a = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make() != false","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xdcb,"void equality_suite::compare_map_equal_boolean_literal()",local_5e,&local_9a);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_98);
  trial::dynamic::basic_map<std::allocator<char>_>::make();
  local_d9 = true;
  local_9c[0] = trial::dynamic::operator==(&local_d8,&local_d9);
  local_da = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make() == true","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xdcc,"void equality_suite::compare_map_equal_boolean_literal()",local_9c,&local_da);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_d8);
  trial::dynamic::basic_map<std::allocator<char>_>::make();
  local_119 = true;
  local_dc[0] = trial::dynamic::operator!=(&local_118,&local_119);
  local_11a = '\x01';
  sVar1 = 0xdcd;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make() != true","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xdcd,"void equality_suite::compare_map_equal_boolean_literal()",local_dc,&local_11a);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_118);
  local_1d4._4_8_ = &local_1c8;
  local_1d4[0] = 1;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_int,_true>
            ((pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              *)local_1d4._4_8_,(char (*) [6])"alpha",local_1d4);
  local_168._0_8_ = &local_1c8;
  local_168._8_8_ = 1;
  init._M_len = sVar1;
  init._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_168 + 0x10),
             (basic_map<std::allocator<char>_> *)local_168._0_8_,init);
  local_1d5 = false;
  local_11c[0] = trial::dynamic::operator==
                           ((basic_variable<std::allocator<char>_> *)(local_168 + 0x10),&local_1d5);
  local_1d6 = '\0';
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make({ {\"alpha\", 1} }) == false","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xdcf,"void equality_suite::compare_map_equal_boolean_literal()",local_11c,&local_1d6)
  ;
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_168 + 0x10));
  ppVar2 = &local_1c8;
  local_410 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
               *)local_168;
  do {
    local_410 = local_410 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_410);
  } while (local_410 != ppVar2);
  local_284._4_8_ = &local_278;
  local_284[0] = 1;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_int,_true>
            ((pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              *)local_284._4_8_,(char (*) [6])"alpha",local_284);
  local_218._0_8_ = &local_278;
  local_218._8_8_ = 1;
  init_00._M_len = (size_type)ppVar2;
  init_00._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_218 + 0x10),
             (basic_map<std::allocator<char>_> *)local_218._0_8_,init_00);
  local_285 = false;
  local_1d8[0] = trial::dynamic::operator!=
                           ((basic_variable<std::allocator<char>_> *)(local_218 + 0x10),&local_285);
  local_286 = '\x01';
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make({ {\"alpha\", 1} }) != false","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xdd0,"void equality_suite::compare_map_equal_boolean_literal()",local_1d8,&local_286)
  ;
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_218 + 0x10));
  ppVar2 = &local_278;
  local_428 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
               *)local_218;
  do {
    local_428 = local_428 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_428);
  } while (local_428 != ppVar2);
  local_334._4_8_ = &local_328;
  local_334[0] = 1;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_int,_true>
            ((pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              *)local_334._4_8_,(char (*) [6])"alpha",local_334);
  local_2c8._0_8_ = &local_328;
  local_2c8._8_8_ = 1;
  init_01._M_len = (size_type)ppVar2;
  init_01._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_2c8 + 0x10),
             (basic_map<std::allocator<char>_> *)local_2c8._0_8_,init_01);
  local_335 = true;
  local_288[0] = trial::dynamic::operator==
                           ((basic_variable<std::allocator<char>_> *)(local_2c8 + 0x10),&local_335);
  local_336 = '\0';
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make({ {\"alpha\", 1} }) == true","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xdd1,"void equality_suite::compare_map_equal_boolean_literal()",local_288,&local_336)
  ;
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_2c8 + 0x10));
  ppVar2 = &local_328;
  local_440 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
               *)local_2c8;
  do {
    local_440 = local_440 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_440);
  } while (local_440 != ppVar2);
  local_3e0 = &local_3d8;
  local_3e4 = 1;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_int,_true>(local_3e0,(char (*) [6])"alpha",&local_3e4);
  local_378._0_8_ = &local_3d8;
  local_378._8_8_ = 1;
  init_02._M_len = (size_type)ppVar2;
  init_02._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_378 + 0x10),
             (basic_map<std::allocator<char>_> *)local_378._0_8_,init_02);
  local_3e5 = true;
  local_338[0] = trial::dynamic::operator!=
                           ((basic_variable<std::allocator<char>_> *)(local_378 + 0x10),&local_3e5);
  local_3e6 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make({ {\"alpha\", 1} }) != true","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xdd2,"void equality_suite::compare_map_equal_boolean_literal()",local_338,&local_3e6)
  ;
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_378 + 0x10));
  local_458 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
               *)local_378;
  do {
    local_458 = local_458 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_458);
  } while (local_458 != &local_3d8);
  return;
}

Assistant:

void compare_map_equal_boolean_literal()
{
    TRIAL_PROTOCOL_TEST_EQUAL(map::make() == false, false);
    TRIAL_PROTOCOL_TEST_EQUAL(map::make() != false, true);
    TRIAL_PROTOCOL_TEST_EQUAL(map::make() == true, false);
    TRIAL_PROTOCOL_TEST_EQUAL(map::make() != true, true);

    TRIAL_PROTOCOL_TEST_EQUAL(map::make({ {"alpha", 1} }) == false, false);
    TRIAL_PROTOCOL_TEST_EQUAL(map::make({ {"alpha", 1} }) != false, true);
    TRIAL_PROTOCOL_TEST_EQUAL(map::make({ {"alpha", 1} }) == true, false);
    TRIAL_PROTOCOL_TEST_EQUAL(map::make({ {"alpha", 1} }) != true, true);
}